

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O0

uint32_t * __thiscall
vsencoding::VSEncoding::compute_OptPartition
          (VSEncoding *this,uint32_t *seq,uint32_t len,uint32_t fixCost,uint32_t *pSize)

{
  long lVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  uint32_t uVar4;
  ulong uVar5;
  void *pvVar6;
  void *pvVar7;
  uint32_t *puVar8;
  runtime_error *this_00;
  uint in_ECX;
  uint in_EDX;
  long in_RSI;
  byte *in_RDI;
  uint *in_R8;
  int next;
  int l;
  int g;
  int j;
  int mleft;
  uint64_t *cost;
  uint64_t curCost;
  uint32_t *part;
  uint32_t maxB;
  uint32_t i;
  int *SSSP;
  int local_80;
  int local_7c;
  uint local_5c;
  int local_58;
  int local_54;
  uint local_50;
  int local_4c;
  ulong local_40;
  uint local_30;
  uint local_2c;
  
  auVar2 = ZEXT416(in_EDX + 1) * ZEXT816(4);
  uVar5 = auVar2._0_8_;
  if (auVar2._8_8_ != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  pvVar6 = operator_new__(uVar5);
  auVar2 = ZEXT416(in_EDX + 1) * ZEXT816(8);
  uVar5 = auVar2._0_8_;
  if (auVar2._8_8_ != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  pvVar7 = operator_new__(uVar5);
  if ((pvVar6 == (void *)0x0) || (pvVar7 == (void *)0x0)) {
    fprintf(_stderr,"Can\'t allocate memory\n");
  }
  for (local_2c = 0; local_2c < in_EDX + 1; local_2c = local_2c + 1) {
    *(undefined4 *)((long)pvVar6 + (ulong)local_2c * 4) = 0xffffffff;
    *(undefined8 *)((long)pvVar7 + (ulong)local_2c * 8) = 0;
  }
  local_2c = 0;
  do {
    if (in_EDX <= local_2c) {
      *in_R8 = 0;
      local_5c = in_EDX;
      while (local_5c != 0) {
        local_5c = *(uint *)((long)pvVar6 + (long)(int)local_5c * 4);
        *in_R8 = *in_R8 + 1;
      }
      auVar2 = ZEXT416(*in_R8 + 1) * ZEXT816(4);
      uVar5 = auVar2._0_8_;
      if (auVar2._8_8_ != 0) {
        uVar5 = 0xffffffffffffffff;
      }
      puVar8 = (uint32_t *)operator_new__(uVar5);
      if (puVar8 != (uint32_t *)0x0) {
        local_2c = *in_R8;
        for (local_5c = in_EDX; local_5c != 0;
            local_5c = *(uint32_t *)((long)pvVar6 + (long)(int)local_5c * 4)) {
          puVar8[local_2c] = local_5c;
          local_2c = local_2c - 1;
        }
        *puVar8 = 0;
        if (pvVar6 != (void *)0x0) {
          operator_delete__(pvVar6);
        }
        if (pvVar7 != (void *)0x0) {
          operator_delete__(pvVar7);
        }
        return puVar8;
      }
      if (pvVar6 != (void *)0x0) {
        operator_delete__(pvVar6);
      }
      if (pvVar7 != (void *)0x0) {
        operator_delete__(pvVar7);
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Can\'t allocate memory");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar3 = local_2c + 1;
    if ((int)(uVar3 - *(int *)(in_RDI + 0x1c)) < 1) {
      local_7c = 0;
    }
    else {
      local_7c = uVar3 - *(int *)(in_RDI + 0x1c);
    }
    local_4c = local_7c;
    local_30 = 0;
    local_58 = 0;
    local_54 = 0;
    for (local_50 = local_2c; local_2c = uVar3, local_4c <= (int)local_50; local_50 = local_50 - 1)
    {
      if (local_30 < *(uint *)(in_RSI + (long)(int)local_50 * 4)) {
        local_30 = *(uint *)(in_RSI + (long)(int)local_50 * 4);
      }
      if (*(long *)(in_RDI + 0x10) == 0) {
        if (uVar3 - local_50 == *(int *)(*(long *)(in_RDI + 8) + (long)local_58 * 4)) {
          local_58 = local_58 + 1;
          goto LAB_001186a2;
        }
      }
      else if (local_30 == 0) {
        if (uVar3 - local_50 == *(int *)(*(long *)(in_RDI + 8) + (long)local_58 * 4)) {
          local_58 = local_58 + 1;
        }
        if (uVar3 - local_50 == *(int *)(*(long *)(in_RDI + 0x10) + (long)local_54 * 4)) {
          if (uVar3 - local_50 == *(int *)(*(long *)(in_RDI + 0x10) + (long)local_54 * 4)) {
            local_54 = local_54 + 1;
          }
          goto LAB_001186a2;
        }
      }
      else {
        if ((int)(uVar3 - *(int *)(in_RDI + 0x1c)) < 1) {
          local_80 = 0;
        }
        else {
          local_80 = uVar3 - *(int *)(*(long *)(in_RDI + 8) +
                                     (ulong)(*(int *)(in_RDI + 0x18) - 1) * 4);
        }
        local_4c = local_80;
        if (uVar3 - local_50 == *(int *)(*(long *)(in_RDI + 8) + (long)local_58 * 4)) {
          if (uVar3 - local_50 == *(int *)(*(long *)(in_RDI + 8) + (long)local_58 * 4)) {
            local_58 = local_58 + 1;
          }
LAB_001186a2:
          if ((*in_RDI & 1) == 0) {
            local_40 = *(long *)((long)pvVar7 + (long)(int)local_50 * 8) +
                       (ulong)((uVar3 - local_50) * local_30) + (ulong)in_ECX;
          }
          else {
            lVar1 = *(long *)((long)pvVar7 + (long)(int)local_50 * 8);
            uVar4 = FastPForLib::div_roundup((uVar3 - local_50) * local_30,0x20);
            local_40 = lVar1 + (ulong)uVar4 + (ulong)in_ECX;
          }
          if (*(int *)((long)pvVar6 + (ulong)uVar3 * 4) == -1) {
            *(ulong *)((long)pvVar7 + (ulong)uVar3 * 8) = local_40 + 1;
          }
          if (local_40 <= *(ulong *)((long)pvVar7 + (ulong)uVar3 * 8)) {
            *(ulong *)((long)pvVar7 + (ulong)uVar3 * 8) = local_40;
            *(uint *)((long)pvVar6 + (ulong)uVar3 * 4) = local_50;
          }
        }
      }
    }
  } while( true );
}

Assistant:

inline uint32_t *VSEncoding::compute_OptPartition(uint32_t *seq, uint32_t len,
                                           uint32_t fixCost, uint32_t &pSize) {
  int *SSSP;
  uint32_t i;
  uint32_t maxB;
  uint32_t *part;
  uint64_t curCost;
  uint64_t *cost;

  /* It will store the shortest path */
  SSSP = new int[len + 1];

  /* cost[i] will contain the cost of encoding up to i-th position */
  cost = new uint64_t[len + 1];

  if (SSSP == NULL || cost == NULL)
    fprintf(stderr, "Can't allocate memory\n");

  for (i = 0; i < len + 1U; ++i) {
    SSSP[i] = -1;
    cost[i] = 0;
  }

  /*
   * This loop computes the cost of the optimal partition.
   * The computation of the max log in each block is done
   * by scanning. Probably we could obtain a faster solution
   * by using RMQ data structures. We use this trivial
   * solution since construction time is not our main concern.
   */
  {
    int mleft;
    int j;
    int g;
    int l;

    for (i = 0U; i < len;) {
      ++i; // rewrite to avoid possibly infinite loop warning
      mleft = (static_cast<int>(i - maxBlk) > 0) ? i - maxBlk : 0;

      for (maxB = 0, l = 0, g = 0, j = i - 1; j >= mleft; j--) {
        if (maxB < seq[j])
          maxB = seq[j];

        if (posszLens == NULL) {
          /*
           * FIXME: If the gaps of elements in possLens[] are
           * sparse, a process below is more efficient to hop
           * these gaps using the elements rather than
           * decrementing j.
           */
          if (i - j != possLens[l])
            continue;
          else
            l++;
        } else {
          /*
           * Treat runs of 0 in a different way.
           * They could form larger blocks!
           */
          if (maxB != 0) {
            mleft = (static_cast<int>(i - maxBlk) > 0)
                        ? i - possLens[poss_sz - 1]
                        : 0;

            if (i - j != possLens[l])
              continue;

            if (i - j == possLens[l])
              l++;
          } else {
            if (i - j == possLens[l])
              l++;

            if (i - j != posszLens[g])
              continue;

            if (i - j == posszLens[g])
              g++;
          }
        }

        /* Caluculate costs */
        if (aligned)
          curCost = cost[j] + div_roundup((i - j) * maxB, 32) + fixCost;
        else
          curCost = cost[j] + (i - j) * maxB + fixCost;

        if (SSSP[i] == -1)
          cost[i] = curCost + 1;

        if (curCost <= cost[i]) {
          cost[i] = curCost;
          SSSP[i] = j;
        }
      }
    }
  }

  /* Compute number of nodes in the path */
  {
    int next;

    pSize = 0;
    next = len;

    while (next != 0) {
      next = SSSP[next];
      pSize++;
    }

    /*
     * Obtain the optimal partition starting
     * from the last block.
     */
    part = new uint32_t[pSize + 1];

    if (part == NULL) {
      /* Finalization */
      delete[] SSSP;
      delete[] cost;
      throw std::runtime_error("Can't allocate memory");
    }

    i = pSize;
    next = len;

    while (next != 0) {
      part[i--] = next;
      next = SSSP[next];
    }

    part[0] = 0;
  }

  /* Finalization */
  delete[] SSSP;
  delete[] cost;

  return part;
}